

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  signals local_fc [11];
  path local_d0;
  undefined1 local_a8 [8];
  logger app_logs;
  
  app_logs.m_selected_file.field_2._12_4_ = 0;
  std::filesystem::__cxx11::path::path<char[7],std::filesystem::__cxx11::path>
            (&local_d0,(char (*) [7])"./logs",auto_format);
  logger::logger((logger *)local_a8,&local_d0);
  std::filesystem::__cxx11::path::~path(&local_d0);
  local_fc[7] = 0;
  handlebars::handles<logger,signals,std::__cxx11::string_const&>::push_event<char_const(&)[9]>
            ((handles<logger,signals,std::__cxx11::string_const&> *)local_a8,local_fc + 7,
             (char (*) [9])"info.log");
  local_fc[6] = 0;
  handlebars::handles<logger,signals,std::__cxx11::string_const&>::push_event<char_const(&)[13]>
            ((handles<logger,signals,std::__cxx11::string_const&> *)local_a8,local_fc + 6,
             (char (*) [13])"warnings.log");
  local_fc[5] = 0;
  handlebars::handles<logger,signals,std::__cxx11::string_const&>::push_event<char_const(&)[11]>
            ((handles<logger,signals,std::__cxx11::string_const&> *)local_a8,local_fc + 5,
             (char (*) [11])"errors.log");
  local_fc[4] = 3;
  handlebars::handles<logger,signals,std::__cxx11::string_const&>::push_event<char_const(&)[9]>
            ((handles<logger,signals,std::__cxx11::string_const&> *)local_a8,local_fc + 4,
             (char (*) [9])"info.log");
  local_fc[3] = 1;
  handlebars::handles<logger,signals,std::__cxx11::string_const&>::push_event<char_const(&)[24]>
            ((handles<logger,signals,std::__cxx11::string_const&> *)local_a8,local_fc + 3,
             (char (*) [24])"application has started");
  local_fc[2] = 2;
  handlebars::handles<logger,signals,std::__cxx11::string_const&>::push_event<char_const(&)[9]>
            ((handles<logger,signals,std::__cxx11::string_const&> *)local_a8,local_fc + 2,
             (char (*) [9])"info.log");
  local_fc[1] = 2;
  handlebars::handles<logger,signals,std::__cxx11::string_const&>::push_event<char_const(&)[13]>
            ((handles<logger,signals,std::__cxx11::string_const&> *)local_a8,local_fc + 1,
             (char (*) [13])"warnings.log");
  local_fc[0] = close;
  handlebars::handles<logger,signals,std::__cxx11::string_const&>::push_event<char_const(&)[11]>
            ((handles<logger,signals,std::__cxx11::string_const&> *)local_a8,local_fc,
             (char (*) [11])"errors.log");
  std::operator<<((ostream *)&std::cout,"Enter a newline to execute pending operations:\n");
  std::istream::get();
  handlebars::
  handles<logger,_signals,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::respond((handles<logger,_signals,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
             *)local_a8,0);
  app_logs.m_selected_file.field_2._12_4_ = 0;
  logger::~logger((logger *)local_a8);
  return app_logs.m_selected_file.field_2._12_4_;
}

Assistant:

int
main()
{
  logger app_logs("./logs");
  app_logs.push_event(signals::open, "info.log");
  app_logs.push_event(signals::open, "warnings.log");
  app_logs.push_event(signals::open, "errors.log");
  app_logs.push_event(signals::select, "info.log");
  app_logs.push_event(signals::write, "application has started");
  app_logs.push_event(signals::close, "info.log");
  app_logs.push_event(signals::close, "warnings.log");
  app_logs.push_event(signals::close, "errors.log");

  std::cout << "Enter a newline to execute pending operations:\n";
  std::cin.get();

  app_logs.respond();
  return 0;
}